

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sap_Apu.cpp
# Opt level: O0

void __thiscall Sap_Apu::write_data(Sap_Apu *this,blip_time_t time,uint addr,int data)

{
  uint uVar1;
  undefined4 in_ECX;
  uint in_EDX;
  long in_RDI;
  int i;
  blip_time_t in_stack_0000006c;
  Sap_Apu *in_stack_00000070;
  
  run_until(in_stack_00000070,in_stack_0000006c);
  uVar1 = (in_EDX ^ 0xd200) >> 1;
  if (uVar1 < 4) {
    *(char *)(in_RDI + (long)(int)uVar1 * 0x18 + (ulong)(in_EDX & 1)) = (char)in_ECX;
  }
  else if (in_EDX == 0xd208) {
    *(undefined4 *)(in_RDI + 0x78) = in_ECX;
  }
  else if (in_EDX == 0xd209) {
    *(undefined4 *)(in_RDI + 8) = 0;
    *(undefined4 *)(in_RDI + 0x20) = 0;
    *(undefined4 *)(in_RDI + 0x38) = 0;
    *(undefined4 *)(in_RDI + 0x50) = 0;
  }
  return;
}

Assistant:

void Sap_Apu::write_data( blip_time_t time, unsigned addr, int data )
{
	run_until( time );
	int i = (addr ^ 0xD200) >> 1;
	if ( i < osc_count )
	{
		oscs [i].regs [addr & 1] = data;
	}
	else if ( addr == 0xD208 )
	{
		control = data;
	}
	else if ( addr == 0xD209 )
	{
		oscs [0].delay = 0;
		oscs [1].delay = 0;
		oscs [2].delay = 0;
		oscs [3].delay = 0;
	}
	/*
	// TODO: are polynomials reset in this case?
	else if ( addr == 0xD20F )
	{
		if ( (data & 3) == 0 )
			polym_pos = 0;
	}
	*/
}